

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example01.c
# Opt level: O0

int main(void)

{
  double dVar1;
  flexfloat_t n4;
  flexfloat_t n3;
  flexfloat_t n2;
  flexfloat_t n1;
  flexfloat_t ff_c;
  flexfloat_t ff_b;
  flexfloat_t ff_a;
  double dbl;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined6 in_stack_ffffffffffffff70;
  flexfloat_desc_t in_stack_ffffffffffffff76;
  flexfloat_t local_78 [3];
  undefined2 local_46;
  undefined1 local_44;
  undefined1 uStack_43;
  undefined1 local_42;
  undefined1 uStack_41;
  flexfloat_t local_40 [3];
  undefined4 local_4;
  
  local_4 = 0;
  local_42 = 0xb;
  uStack_41 = 0x34;
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22359303181637e-318,in_stack_ffffffffffffff76);
  local_44 = 0xb;
  uStack_43 = 0x34;
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.2237560734795e-318,in_stack_ffffffffffffff76);
  local_46 = 0x340b;
  ff_init(local_40,(flexfloat_desc_t)0x340b);
  ff_add((flexfloat_t *)CONCAT26(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x102241);
  ff_get_double(local_40);
  printf("[printf] ff_c = %f\n");
  dVar1 = ff_get_double(local_40);
  if (dVar1 == 21.9) {
    printf("checksum ok\n");
  }
  else {
    printf("checksum WRONG!!!");
  }
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22464539164201e-318,in_stack_ffffffffffffff76);
  ff_init_double((flexfloat_t *)
                 CONCAT17(in_stack_ffffffffffffff6f,
                          CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
                 5.22480843330514e-318,in_stack_ffffffffffffff76);
  ff_init(local_78,(flexfloat_desc_t)0xa05);
  ff_add((flexfloat_t *)CONCAT26(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70),
         (flexfloat_t *)
         CONCAT17(in_stack_ffffffffffffff6f,
                  CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
         (flexfloat_t *)0x102316);
  ff_get_double(local_78);
  printf("n1+n2 = %f\n");
  ff_cast((flexfloat_t *)
          CONCAT17(in_stack_ffffffffffffff6f,
                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)),
          (flexfloat_t *)0x10234c,in_stack_ffffffffffffff76);
  ff_get_double(local_78);
  printf("n3 = %f\n");
  ff_cast((flexfloat_t *)CONCAT17(7,CONCAT16(8,in_stack_ffffffffffffff68)),(flexfloat_t *)0x102382,
          in_stack_ffffffffffffff76);
  ff_get_double((flexfloat_t *)&stack0xffffffffffffff70);
  printf("n4 = %f\n");
  return 0;
}

Assistant:

int main(){

    double dbl;

    // Double-precision variables
    flexfloat_t ff_a, ff_b, ff_c;
    ff_init_double(&ff_a, 10.4, (flexfloat_desc_t) {11, 52});
    ff_init_double(&ff_b, 11.5, (flexfloat_desc_t) {11, 52});
    ff_init(&ff_c, (flexfloat_desc_t) {11, 52});
    // Arithmetic operators
    ff_add(&ff_c, &ff_a, &ff_b); // c=a+b
    // C-style printf (it requires an explicit cast)
    printf("[printf] ff_c = %f\n", ff_get_double(&ff_c));
    // checksum with double result
    if(ff_get_double(&ff_c) == (10.4+11.5)) printf("checksum ok\n");
    else printf("checksum WRONG!!!");

    // IEEE float16: 5 bits (exponent) + 10 bits (explicit mantissa)
    flexfloat_t n1, n2, n3;
    ff_init_double(&n1, 1.11, (flexfloat_desc_t) {5, 10});
    ff_init_double(&n2, 3.754, (flexfloat_desc_t) {5, 10});
    ff_init(&n3, (flexfloat_desc_t) {5, 10});

    ff_add(&n3, &n1, &n2);
    printf("n1+n2 = %f\n", ff_get_double(&n3));
    // Automatic cast from different precisions
    ff_cast(&n3, &ff_c, (flexfloat_desc_t) {5, 10}); //  n3 = ff_c;
    printf("n3 = %f\n", ff_get_double(&n3));

    // float16 with extended dynamic: : 8 bits (exponent) + 7 bits (explicit mantissa)
    flexfloat_t n4;
    ff_cast(&n4, &n3, (flexfloat_desc_t) {8, 7}); // n4 = n3
    printf("n4 = %f\n", ff_get_double(&n4));

    return 0;
}